

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Metadata.cpp
# Opt level: O3

void __thiscall Assimp::X3DImporter::ParseNode_MetadataDouble(X3DImporter *this)

{
  size_t *psVar1;
  FIReader *pFVar2;
  char *pcVar3;
  CX3DImporter_NodeElement *pCVar4;
  list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_> *plVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  undefined4 extraout_var;
  char *__s;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  _List_node_base *p_Var9;
  CX3DImporter_NodeElement *pParentElement;
  string *extraout_RDX;
  string *psVar10;
  uint uVar11;
  ulong uVar12;
  CX3DImporter_NodeElement *ne;
  string an;
  string use;
  string def;
  vector<double,_std::allocator<double>_> value;
  string reference;
  string name;
  allocator<char> local_f9;
  CX3DImporter_NodeElement *local_f8;
  uint local_ec;
  string local_e8;
  string local_c8;
  string local_a8;
  vector<double,_std::allocator<double>_> local_88;
  string local_70;
  string local_50;
  undefined4 extraout_var_00;
  
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  local_a8._M_string_length = 0;
  local_a8.field_2._M_local_buf[0] = '\0';
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  local_c8._M_string_length = 0;
  local_c8.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_f8 = (CX3DImporter_NodeElement *)0x0;
  uVar7 = (*(((this->mReader)._M_t.
              super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
              super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
              super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
            super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[4])();
  if (0 < (int)uVar7) {
    uVar12 = 0;
    local_ec = uVar7;
    do {
      pFVar2 = (this->mReader)._M_t.
               super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
               super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
               super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
      iVar8 = (*(pFVar2->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[5])
                        (pFVar2,uVar12);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e8,(char *)CONCAT44(extraout_var,iVar8),&local_f9);
      iVar8 = std::__cxx11::string::compare((char *)&local_e8);
      if (iVar8 == 0) {
        iVar8 = (*(((this->mReader)._M_t.
                    super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                    .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                  super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])();
        __s = (char *)CONCAT44(extraout_var_00,iVar8);
        psVar10 = &local_a8;
LAB_005ef4e2:
        pcVar3 = (char *)psVar10->_M_string_length;
        strlen(__s);
        std::__cxx11::string::_M_replace((ulong)psVar10,0,pcVar3,(ulong)__s);
        uVar7 = local_ec;
      }
      else {
        iVar8 = std::__cxx11::string::compare((char *)&local_e8);
        if (iVar8 == 0) {
          iVar8 = (*(((this->mReader)._M_t.
                      super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                      .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                    super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])();
          __s = (char *)CONCAT44(extraout_var_01,iVar8);
          psVar10 = &local_c8;
          goto LAB_005ef4e2;
        }
        iVar8 = std::__cxx11::string::compare((char *)&local_e8);
        if (((iVar8 != 0) && (iVar8 = std::__cxx11::string::compare((char *)&local_e8), iVar8 != 0))
           && (iVar8 = std::__cxx11::string::compare((char *)&local_e8), iVar8 != 0)) {
          iVar8 = std::__cxx11::string::compare((char *)&local_e8);
          if (iVar8 == 0) {
            iVar8 = (*(((this->mReader)._M_t.
                        super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                        .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                      super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])();
            __s = (char *)CONCAT44(extraout_var_02,iVar8);
            psVar10 = &local_50;
          }
          else {
            iVar8 = std::__cxx11::string::compare((char *)&local_e8);
            if (iVar8 != 0) {
              iVar8 = std::__cxx11::string::compare((char *)&local_e8);
              if (iVar8 == 0) {
                XML_ReadNode_GetAttrVal_AsArrD(this,(int)uVar12,&local_88);
              }
              else {
                Throw_IncorrectAttr(this,&local_e8);
              }
              goto LAB_005ef505;
            }
            iVar8 = (*(((this->mReader)._M_t.
                        super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                        .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                      super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])();
            __s = (char *)CONCAT44(extraout_var_03,iVar8);
            psVar10 = &local_70;
          }
          goto LAB_005ef4e2;
        }
      }
LAB_005ef505:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
      uVar11 = (int)uVar12 + 1;
      uVar12 = (ulong)uVar11;
    } while (uVar7 != uVar11);
  }
  if (local_c8._M_string_length == 0) {
    pParentElement = (CX3DImporter_NodeElement *)operator_new(0xa8);
    pCVar4 = this->NodeElement_Cur;
    pParentElement->Type = ENET_MetaDouble;
    (pParentElement->ID)._M_dataplus._M_p = (pointer)&(pParentElement->ID).field_2;
    (pParentElement->ID)._M_string_length = 0;
    (pParentElement->ID).field_2._M_local_buf[0] = '\0';
    pParentElement->Parent = pCVar4;
    (pParentElement->Child).
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&pParentElement->Child;
    (pParentElement->Child).
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&pParentElement->Child;
    (pParentElement->Child).
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node._M_size = 0;
    pParentElement[1]._vptr_CX3DImporter_NodeElement = (_func_int **)&pParentElement[1].ID;
    *(undefined8 *)&pParentElement[1].Type = 0;
    *(undefined1 *)&pParentElement[1].ID._M_dataplus._M_p = 0;
    pParentElement[1].ID.field_2._M_allocated_capacity = (size_type)&pParentElement[1].Parent;
    *(undefined8 *)((long)&pParentElement[1].ID.field_2 + 8) = 0;
    *(undefined1 *)&pParentElement[1].Parent = 0;
    pParentElement->_vptr_CX3DImporter_NodeElement =
         (_func_int **)&PTR__CX3DImporter_NodeElement_MetaDouble_00989fc0;
    pParentElement[1].Child.
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
    pParentElement[1].Child.
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node._M_size = 0;
    pParentElement[2]._vptr_CX3DImporter_NodeElement = (_func_int **)0x0;
    local_f8 = pParentElement;
    if (local_a8._M_string_length != 0) {
      std::__cxx11::string::_M_assign((string *)&pParentElement->ID);
    }
    std::__cxx11::string::_M_assign((string *)pParentElement[1].ID.field_2._M_local_buf);
    std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)
               &pParentElement[1].Child.
                super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                ._M_impl._M_node.super__List_node_base._M_prev,&local_88);
    iVar8 = (*(((this->mReader)._M_t.
                super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t
                .super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
                super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
              super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xf])();
    if ((char)iVar8 == '\0') {
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"MetadataDouble","");
      ParseNode_Metadata(this,pParentElement,extraout_RDX);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      pCVar4 = this->NodeElement_Cur;
      p_Var9 = (_List_node_base *)operator_new(0x18);
      p_Var9[1]._M_next = (_List_node_base *)pParentElement;
      std::__detail::_List_node_base::_M_hook(p_Var9);
      psVar1 = &(pCVar4->Child).
                super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
    }
    p_Var9 = (_List_node_base *)operator_new(0x18);
    p_Var9[1]._M_next = (_List_node_base *)pParentElement;
    std::__detail::_List_node_base::_M_hook(p_Var9);
    plVar5 = &this->NodeElement_List;
  }
  else {
    XML_CheckNode_MustBeEmpty(this);
    if (local_a8._M_string_length != 0) {
      Throw_DEF_And_USE(this);
    }
    bVar6 = FindNodeElement(this,&local_c8,ENET_MetaDouble,&local_f8);
    if (!bVar6) {
      Throw_USE_NotFound(this,&local_c8);
    }
    pCVar4 = this->NodeElement_Cur;
    p_Var9 = (_List_node_base *)operator_new(0x18);
    p_Var9[1]._M_next = (_List_node_base *)local_f8;
    std::__detail::_List_node_base::_M_hook(p_Var9);
    plVar5 = &pCVar4->Child;
  }
  psVar1 = &(plVar5->
            super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
            )._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  if (local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,
                    CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                             local_c8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,
                    CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                             local_a8.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void X3DImporter::ParseNode_MetadataDouble()
{
    std::string def, use;
    std::string name, reference;
    std::vector<double> value;
    CX3DImporter_NodeElement* ne( nullptr );

	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECKUSEDEF_RET(def, use);
		MACRO_ATTRREAD_CHECK_RET("name", name, mReader->getAttributeValue);
		MACRO_ATTRREAD_CHECK_RET("reference", reference, mReader->getAttributeValue);
		MACRO_ATTRREAD_CHECK_REF("value", value, XML_ReadNode_GetAttrVal_AsArrD);
	MACRO_ATTRREAD_LOOPEND;

	MACRO_METADATA_FINDCREATE(def, use, reference, value, ne, CX3DImporter_NodeElement_MetaDouble, "MetadataDouble", ENET_MetaDouble);
}